

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O2

void util_bits::DeinterleaveUint8(uint32 x,uint8 *a,uint8 *b,uint8 *c)

{
  *a = (uint8)(((x & 0x249249) * 0x15 & 0x381c0c) * 0x1041 >> 0xe);
  *b = (uint8)(((x >> 1 & 0x249249) * 0x15 & 0x381c0c) * 0x1041 >> 0xe);
  *c = (uint8)(((x >> 2 & 0x249249) * 0x15 & 0x381c0c) * 0x1041 >> 0xe);
  return;
}

Assistant:

void DeinterleaveUint8(uint32 x, uint8* a, uint8* b, uint8* c) {
  *a = UnsplitFor3(x);
  *b = UnsplitFor3(x >> 1);
  *c = UnsplitFor3(x >> 2);
}